

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::checkForDeadlock
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  mapped_type *this_00;
  ulong uVar6;
  size_type sVar7;
  __0 local_340 [32];
  uint local_320;
  allocator local_319;
  uint32_t j;
  string spacePrefix;
  __0 local_2f8 [32];
  undefined1 local_2d8 [8];
  vector<int,_std::allocator<int>_> dagIDsInPath;
  pair<std::vector<int,_std::allocator<int>_>,_bool> path;
  __0 local_298 [4];
  uint32_t maxPathLength;
  string toAction;
  __0 local_278 [8];
  string fromAction;
  ZEeventsChecker *local_258;
  anon_class_8_1_8991fb9c getActionDetails;
  uint32_t dagID;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_240;
  iterator it_1;
  undefined1 local_230 [4];
  uint32_t i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [8];
  string action;
  uint local_1e8;
  uint32_t i_1;
  ostringstream local_1d8 [8];
  ostringstream oss;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_60;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_58;
  uint local_4c;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> _Stack_48;
  uint32_t i;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_40;
  iterator it;
  uint32_t this_action_new_node_id;
  ze_event_handle_t *phWaitEvents_local;
  ze_event_handle_t p_Stack_20;
  uint32_t numWaitEvents_local;
  ze_event_handle_t hSignalEvent_local;
  string *zeCallDisc_local;
  ZEeventsChecker *this_local;
  
  it.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur.
  _4_4_ = 0xffffffff;
  p_Stack_20 = hSignalEvent;
  hSignalEvent_local = (ze_event_handle_t)zeCallDisc;
  zeCallDisc_local = (string *)this;
  if (hSignalEvent != (ze_event_handle_t)0x0) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
         ::find(&this->eventToDagID,&stack0xffffffffffffffe0);
    _Stack_48._M_cur =
         (__node_type *)
         std::
         unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
         ::end(&this->eventToDagID);
    bVar1 = std::__detail::operator==(&local_40,&stack0xffffffffffffffb8);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Warning: hSignalEvent {");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,p_Stack_20);
      poVar4 = std::operator<<(poVar4,"} might be an invalid event in call to ");
      poVar4 = std::operator<<(poVar4,(string *)hSignalEvent_local);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      return;
    }
    validateSignalEventOwnership(this,(string *)hSignalEvent_local,p_Stack_20);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                         *)&local_40);
    if (ppVar3->second != 0xffffffff) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
               operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                           *)&local_40);
      it.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur
      ._4_4_ = ppVar3->second;
    }
  }
  for (local_4c = 0; local_4c < numWaitEvents; local_4c = local_4c + 1) {
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
         ::find(&this->eventToDagID,phWaitEvents + local_4c);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
         ::end(&this->eventToDagID);
    bVar1 = std::__detail::operator==(&local_58,&local_60);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Warning: phWaitEvents {");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,p_Stack_20);
      poVar4 = std::operator<<(poVar4,"} might be an invalid event in call to ");
      poVar4 = std::operator<<(poVar4,(string *)hSignalEvent_local);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      return;
    }
  }
  if (it.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur
      ._4_4_ == 0xffffffff) {
    uVar2 = addNodeInDag(this);
    it.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur.
    _4_4_ = uVar2;
    pmVar5 = std::
             unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
             ::operator[](&this->eventToDagID,&stack0xffffffffffffffe0);
    *pmVar5 = uVar2;
  }
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar4 = std::operator<<((ostream *)local_1d8,(string *)hSignalEvent_local);
  poVar4 = std::operator<<(poVar4,": (hSignalEvent{");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,p_Stack_20);
  std::operator<<(poVar4,"}, phWaitEvents{");
  for (local_1e8 = 0; local_1e8 < numWaitEvents; local_1e8 = local_1e8 + 1) {
    std::ostream::operator<<((ostream *)local_1d8,phWaitEvents[local_1e8]);
    if (local_1e8 < numWaitEvents - 1) {
      std::operator<<((ostream *)local_1d8,", ");
    }
  }
  std::operator<<((ostream *)local_1d8,"})");
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>
              *)local_230,local_208,&stack0xffffffffffffffe0);
  this_00 = std::
            unordered_map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>_>
            ::operator[](&this->dagIDToAction,
                         (key_type *)
                         ((long)&it.
                                 super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                                 ._M_cur + 4));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>
  ::operator=(this_00,(type)local_230);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>
           *)local_230);
  it_1.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur.
  _4_4_ = 0;
  do {
    if (numWaitEvents <=
        it_1.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
        _M_cur._4_4_) {
      getActionDetails.this._4_4_ = 0;
LAB_00254f7a:
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::ostringstream::~ostringstream(local_1d8);
      return;
    }
    local_240._M_cur =
         (__node_type *)
         std::
         unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
         ::find(&this->eventToDagID,
                phWaitEvents +
                it_1.
                super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                ._M_cur._4_4_);
    _dagID = (__node_type *)
             std::
             unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
             ::end(&this->eventToDagID);
    bVar1 = std::__detail::operator==
                      (&local_240,
                       (_Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                        *)&dagID);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Warning: phWaitEvents {");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,phWaitEvents
                                 [it_1.
                                  super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                                  ._M_cur._4_4_]);
      poVar4 = std::operator<<(poVar4,"} might be an invalid event in call to ");
      poVar4 = std::operator<<(poVar4,(string *)hSignalEvent_local);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      getActionDetails.this._4_4_ = 1;
      goto LAB_00254f7a;
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                         *)&local_240);
    getActionDetails.this._0_4_ = ppVar3->second;
    if ((uint)getActionDetails.this == 0xffffffff) {
      uVar2 = addNodeInDag(this);
      getActionDetails.this._0_4_ = uVar2;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
               operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                           *)&local_240);
      ppVar3->second = uVar2;
    }
    local_258 = this;
    bVar1 = addEdgeInDag(this,(uint)getActionDetails.this,
                         it.
                         super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                         ._M_cur._4_4_);
    if (!bVar1) {
      checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
      ::$_0::operator()[abi_cxx11_(local_278,(int)&local_258);
      checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
      ::$_0::operator()[abi_cxx11_(local_298,(int)&local_258);
      std::operator<<((ostream *)&std::cerr,"Warning: There may be a potential event deadlock!\n");
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Adding the following dependency would create a cycle in the DAG:\n\tFrom: "
                              );
      poVar4 = std::operator<<(poVar4,(string *)local_278);
      poVar4 = std::operator<<(poVar4,"\n\tTo: ");
      poVar4 = std::operator<<(poVar4,(string *)local_298);
      std::operator<<(poVar4,"\n");
      std::operator<<((ostream *)&std::cerr,"There is already a path:\n");
      xla::GraphCycles::PathDagIDs
                ((pair<std::vector<int,_std::allocator<int>_>,_bool> *)
                 &dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&this->dag,
                 it.
                 super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                 ._M_cur._4_4_,(uint)getActionDetails.this,0xf);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2d8,
                 (vector<int,_std::allocator<int>_> *)
                 &dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)local_2d8,0);
      checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
      ::$_0::operator()[abi_cxx11_(local_2f8,(int)&local_258);
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)local_2f8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)local_2f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&j,"",&local_319);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      for (local_320 = 1; uVar6 = (ulong)local_320,
          sVar7 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_2d8), uVar6 < sVar7;
          local_320 = local_320 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&j);
        poVar4 = std::operator<<(poVar4,"|\n");
        poVar4 = std::operator<<(poVar4,(string *)&j);
        poVar4 = std::operator<<(poVar4,"-> ");
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)local_2d8,(ulong)local_320);
        checkForDeadlock(std::__cxx11::string_const&,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t*const*)
        ::$_0::operator()[abi_cxx11_(local_340,(int)&local_258);
        poVar4 = std::operator<<(poVar4,(string *)local_340);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)local_340);
        std::__cxx11::string::operator+=((string *)&j,"   ");
      }
      if (((byte)path.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage & 1) != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&j);
        poVar4 = std::operator<<(poVar4,"|\n");
        poVar4 = std::operator<<(poVar4,(string *)&j);
        std::operator<<(poVar4,"-> ...\n");
      }
      std::__cxx11::string::~string((string *)&j);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_2d8);
      std::pair<std::vector<int,_std::allocator<int>_>,_bool>::~pair
                ((pair<std::vector<int,_std::allocator<int>_>,_bool> *)
                 &dagIDsInPath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::~string((string *)local_278);
    }
    it_1.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur
    ._4_4_ = it_1.
             super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
             _M_cur._4_4_ + 1;
  } while( true );
}

Assistant:

void eventsChecker::ZEeventsChecker::checkForDeadlock(
    const std::string &zeCallDisc,        /// action discription
    const ze_event_handle_t hSignalEvent, ///< [in][optional] handle of the event to forming the outgoing edge in the DAG
    const uint32_t numWaitEvents,         ///< [in][optional] number of events that point to this action.
    const ze_event_handle_t *phWaitEvents ///< [in][optional][range(0, numWaitEvents)] handle of the events that point to this action.
) {

    uint32_t this_action_new_node_id = invalidDagID;

    if (hSignalEvent != nullptr) {

        auto it = eventToDagID.find(hSignalEvent);
        // Check if user is using invalid events, hint if it doesn't exist in eventToDagID.
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: hSignalEvent {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }

        // A passive check to see if the user is using the same event for multiple actions.
        // It only print warnings and does not stop the event deadlock checker.
        validateSignalEventOwnership(zeCallDisc, hSignalEvent);

        if (it->second != invalidDagID) {
            // This event already exists in the DAG. Get the DAG node ID.
            // For example when there is indeed a deadlock it would have already been created.
            this_action_new_node_id = it->second;
        }
    }

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        if (eventToDagID.find(phWaitEvents[i]) == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
    }

    if (this_action_new_node_id == invalidDagID) {
        // Create node in DAG
        this_action_new_node_id = addNodeInDag();

        // Now we know where the hSignalEvent points from/out in the DAG. Update the eventToDagID map.
        eventToDagID[hSignalEvent] = this_action_new_node_id;
    }

    // Add this action to the actionToDagID map.
    std::ostringstream oss;
    oss << zeCallDisc << ": (hSignalEvent{" << hSignalEvent << "}, phWaitEvents{";

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        oss << phWaitEvents[i];
        if (i < numWaitEvents - 1) {
            oss << ", ";
        }
    }
    oss << "})";

    std::string action = oss.str(); // Convert the stream to a string.
    dagIDToAction[this_action_new_node_id] = actionAndSignalEvent(action, hSignalEvent);

    // Form the dependency in the DAG
    for (uint32_t i = 0; i < numWaitEvents; i++) {
        auto it = eventToDagID.find(phWaitEvents[i]);
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << phWaitEvents[i] << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
        uint32_t dagID = it->second;
        if (dagID == invalidDagID) {
            // Create a new node in the DAG for this wait event. That action will be created some time in the future.
            dagID = addNodeInDag();
            it->second = dagID;
        }

        auto getActionDetails = [&](int dagID) -> std::string {
            auto actionIt = dagIDToAction.find(dagID);
            return (actionIt != dagIDToAction.end()) ? actionIt->second.first : "PLACEHOLDER";
        };

        if (!addEdgeInDag(dagID, this_action_new_node_id)) {
            std::string fromAction = getActionDetails(dagID);
            std::string toAction = getActionDetails(this_action_new_node_id);

            std::cerr << "Warning: There may be a potential event deadlock!\n";
            std::cerr << "Adding the following dependency would create a cycle in the DAG:\n\tFrom: " << fromAction << "\n\tTo: " << toAction << "\n";
            std::cerr << "There is already a path:\n";

            constexpr uint32_t maxPathLength = 15;
            auto path = dag.PathDagIDs(this_action_new_node_id, dagID, maxPathLength);
            auto dagIDsInPath = path.first;
            std::cerr << getActionDetails(dagIDsInPath[0]) << "\n";
            std::string spacePrefix = "";
            for (uint32_t j = 1; j < dagIDsInPath.size(); j++) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> " << getActionDetails(dagIDsInPath[j]) << "\n";
                spacePrefix += "   ";
            }
            if (path.second) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> ...\n";
            }
        }
    }
}